

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

_Bool cpu_handle_exception(CPUState *cpu,int *ret)

{
  uc_struct_conflict7 *puVar1;
  _Bool _Var2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  list_item *local_48;
  list_item *cur_1;
  list_item *cur;
  hook *hook;
  uc_struct_conflict15 *uc;
  _Bool catched;
  int *ret_local;
  CPUState *cpu_local;
  
  puVar1 = cpu->uc;
  if ((cpu->uc->stop_interrupt == (uc_args_int_t_conflict7)0x0) ||
     (_Var2 = (*cpu->uc->stop_interrupt)(cpu->uc,cpu->exception_index), !_Var2)) {
    if (cpu->exception_index < 0) {
      cpu_local._7_1_ = false;
    }
    else if (cpu->exception_index < 0x10000) {
      bVar4 = false;
      local_48 = puVar1->hook[0].head;
      while( true ) {
        bVar5 = false;
        if (local_48 != (list_item *)0x0) {
          cur = (list_item *)local_48->data;
          bVar5 = cur != (list_item *)0x0;
        }
        if (!bVar5) break;
        if (((ulong)cur[1].next & 0x100000000) == 0) {
          (*(code *)cur[2].data)(puVar1,cpu->exception_index,cur[3].next);
          bVar4 = true;
        }
        local_48 = local_48->next;
      }
      if (bVar4) {
        cpu->exception_index = -1;
        *ret = 0x10000;
        cpu_local._7_1_ = false;
      }
      else {
        puVar1->invalid_error = 0x15;
        cpu->halted = 1;
        *ret = 0x10001;
        cpu_local._7_1_ = true;
      }
    }
    else {
      *ret = cpu->exception_index;
      if (*ret == 0x10002) {
        cpu_handle_debug_exception(cpu);
      }
      cpu->exception_index = -1;
      cpu_local._7_1_ = true;
    }
  }
  else {
    uc._7_1_ = 0;
    cur_1 = puVar1->hook[0xe].head;
    while( true ) {
      bVar4 = false;
      if (cur_1 != (list_item *)0x0) {
        cur = (list_item *)cur_1->data;
        bVar4 = cur != (list_item *)0x0;
      }
      if (!bVar4) break;
      if (((ulong)cur[1].next & 0x100000000) == 0) {
        bVar3 = (*(code *)cur[2].data)(puVar1,cur[3].next);
        uc._7_1_ = bVar3 & 1;
        if (uc._7_1_ != 0) break;
      }
      cur_1 = cur_1->next;
    }
    if (uc._7_1_ == 0) {
      puVar1->invalid_error = 10;
    }
    *ret = 0x10001;
    cpu_local._7_1_ = true;
  }
  return cpu_local._7_1_;
}

Assistant:

static inline bool cpu_handle_exception(CPUState *cpu, int *ret)
{
    bool catched = false;
    struct uc_struct *uc = cpu->uc;
    struct hook *hook;

    // printf(">> exception index = %u\n", cpu->exception_index); qq

    if (cpu->uc->stop_interrupt && cpu->uc->stop_interrupt(cpu->uc, cpu->exception_index)) {
        // Unicorn: call registered invalid instruction callbacks
        catched = false;
        HOOK_FOREACH_VAR_DECLARE;
        HOOK_FOREACH(uc, hook, UC_HOOK_INSN_INVALID) {
            if (hook->to_delete) {
                continue;
            }
            catched = ((uc_cb_hookinsn_invalid_t)hook->callback)(uc, hook->user_data);
            if (catched) {
                break;
            }
        }
        if (!catched) {
            uc->invalid_error = UC_ERR_INSN_INVALID;
        }

        // we want to stop emulation
        *ret = EXCP_HLT;
        return true;
    }

    if (cpu->exception_index < 0) {
        return false;
    }

    if (cpu->exception_index >= EXCP_INTERRUPT) {
        /* exit request from the cpu execution loop */
        *ret = cpu->exception_index;
        if (*ret == EXCP_DEBUG) {
            cpu_handle_debug_exception(cpu);
        }
        cpu->exception_index = -1;
        return true;
    } else {
#if defined(TARGET_X86_64)
        CPUArchState *env = cpu->env_ptr;
        if (env->exception_is_int) {
            // point EIP to the next instruction after INT
            env->eip = env->exception_next_eip;
        }
#endif
#if defined(TARGET_MIPS) || defined(TARGET_MIPS64)
        // Unicorn: Imported from https://github.com/unicorn-engine/unicorn/pull/1098
        CPUMIPSState *env = &(MIPS_CPU(cpu)->env);
        env->active_tc.PC = uc->next_pc;
#endif
#if defined(TARGET_RISCV)
        CPURISCVState *env = &(RISCV_CPU(uc->cpu)->env);
        env->pc += 4;
#endif
#if defined(TARGET_PPC)
        CPUPPCState *env = &(POWERPC_CPU(uc->cpu)->env);
        env->nip += 4;
#endif
        // Unicorn: call registered interrupt callbacks
        catched = false;
        HOOK_FOREACH_VAR_DECLARE;
        HOOK_FOREACH(uc, hook, UC_HOOK_INTR) {
            if (hook->to_delete) {
                continue;
            }
            ((uc_cb_hookintr_t)hook->callback)(uc, cpu->exception_index, hook->user_data);
            catched = true;
        }
        // Unicorn: If un-catched interrupt, stop executions.
        if (!catched) {
            // printf("AAAAAAAAAAAA\n"); qq
            uc->invalid_error = UC_ERR_EXCEPTION;
            cpu->halted = 1;
            *ret = EXCP_HLT;
            return true;
        }

        cpu->exception_index = -1;
    }

    *ret = EXCP_INTERRUPT;
    return false;
}